

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O1

int __thiscall
EventDispatcherHelper::addEventListener
          (EventDispatcherHelper *this,IEventListener *listener,int event_id)

{
  Node *pNVar1;
  EventListenerNode *pEVar2;
  Node *pNVar3;
  AutoLock _auto_lock_;
  AutoLock AStack_38;
  
  AutoLock::AutoLock(&AStack_38,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                     ,0x66);
  pEVar2 = (EventListenerNode *)
           operator_new(0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                        ,0x68);
  pEVar2->mListener = listener;
  pEVar2->mEventId = event_id;
  pNVar3 = (Node *)operator_new(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                ,0xa7);
  pNVar3->val = pEVar2;
  pNVar1 = (this->mEventList).mTail;
  pNVar3->prev = pNVar1->prev;
  pNVar3->next = pNVar1;
  pNVar1->prev->next = pNVar3;
  pNVar1->prev = pNVar3;
  AutoLock::~AutoLock(&AStack_38);
  return 0;
}

Assistant:

int EventDispatcherHelper::addEventListener( IEventListener *listener, int event_id )
{
	DebugAutoLock( mLock );
	
	EventListenerNode *node = jh_new EventListenerNode;
	
	node->mListener = listener;
	node->mEventId = event_id;
	
	mEventList.push_back( node );

	return 0;
}